

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# js_generator.cc
# Opt level: O2

void __thiscall
google::protobuf::compiler::js::Generator::GenerateEnum
          (Generator *this,GeneratorOptions *options,Printer *printer,EnumDescriptor *enumdesc)

{
  int iVar1;
  long lVar2;
  pointer piVar3;
  pointer piVar4;
  AlphaNum *a;
  long lVar5;
  EnumValueDescriptor *descriptor;
  pair<std::_Rb_tree_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_bool>
  pVar6;
  vector<int,_std::allocator<int>_> valid_index;
  char *local_d8;
  string local_d0;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  used_name;
  AlphaNum local_80;
  string local_50;
  
  (anonymous_namespace)::GetEnumPathPrefix_abi_cxx11_
            ((string *)&used_name,(_anonymous_namespace_ *)options,(GeneratorOptions *)enumdesc,
             enumdesc);
  io::Printer::Print<char[11],std::__cxx11::string,char[5],std::__cxx11::string>
            (printer,"/**\n * @enum {number}\n */\n$enumprefix$$name$ = {\n",
             (char (*) [11])"enumprefix",(string *)&used_name,(char (*) [5])0x3de831,
             *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)(enumdesc + 8));
  std::__cxx11::string::~string((string *)&used_name);
  io::Printer::Annotate<google::protobuf::EnumDescriptor>(printer,"name",enumdesc);
  used_name._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &used_name._M_t._M_impl.super__Rb_tree_header._M_header;
  used_name._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  used_name._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  used_name._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  valid_index.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  valid_index.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)0x0;
  valid_index.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_d0._M_dataplus._M_p._0_4_ = 0;
  used_name._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       used_name._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  do {
    piVar3 = valid_index.super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_finish;
    if (*(int *)(enumdesc + 4) <= (int)local_d0._M_dataplus._M_p) {
      for (piVar4 = valid_index.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start; piVar4 != piVar3; piVar4 = piVar4 + 1) {
        iVar1 = *piVar4;
        lVar2 = *(long *)(enumdesc + 0x28);
        lVar5 = (long)iVar1 * 0x20;
        anon_unknown_0::ToEnumCase(&local_d0,*(string **)(lVar2 + 8 + lVar5));
        descriptor = (EnumValueDescriptor *)(lVar2 + lVar5);
        strings::AlphaNum::AlphaNum(&local_80,*(int *)(descriptor + 4));
        StrCat_abi_cxx11_(&local_50,(protobuf *)&local_80,a);
        local_d8 = ",";
        if (iVar1 == valid_index.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_finish[-1]) {
          local_d8 = "";
        }
        io::Printer::
        Print<char[5],std::__cxx11::string,char[6],std::__cxx11::string,char[6],char_const*>
                  (printer,"  $name$: $value$$comma$\n",(char (*) [5])0x3de831,&local_d0,
                   (char (*) [6])0x4289cc,&local_50,(char (*) [6])"comma",&local_d8);
        std::__cxx11::string::~string((string *)&local_50);
        std::__cxx11::string::~string((string *)&local_d0);
        io::Printer::Annotate<google::protobuf::EnumValueDescriptor>(printer,"name",descriptor);
      }
      io::Printer::Print<>(printer,"};\n\n");
      std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                (&valid_index.super__Vector_base<int,_std::allocator<int>_>);
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~_Rb_tree(&used_name._M_t);
      return;
    }
    if (*(char *)(*(long *)(enumdesc + 0x20) + 0x48) == '\x01') {
      anon_unknown_0::ToEnumCase
                ((string *)&local_80,
                 *(string **)
                  (*(long *)(enumdesc + 0x28) + 8 + (long)(int)local_d0._M_dataplus._M_p * 0x20));
      pVar6 = std::
              _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
              ::_M_insert_unique<std::__cxx11::string>
                        ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                          *)&used_name,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &local_80);
      std::__cxx11::string::~string((string *)&local_80);
      if (((undefined1  [16])pVar6 & (undefined1  [16])0x1) != (undefined1  [16])0x0)
      goto LAB_0029a031;
    }
    else {
LAB_0029a031:
      std::vector<int,_std::allocator<int>_>::push_back
                (&valid_index,(value_type_conflict2 *)&local_d0);
    }
    local_d0._M_dataplus._M_p._0_4_ = (int)local_d0._M_dataplus._M_p + 1;
  } while( true );
}

Assistant:

void Generator::GenerateEnum(const GeneratorOptions& options,
                             io::Printer* printer,
                             const EnumDescriptor* enumdesc) const {
  printer->Print(
      "/**\n"
      " * @enum {number}\n"
      " */\n"
      "$enumprefix$$name$ = {\n",
      "enumprefix", GetEnumPathPrefix(options, enumdesc), "name",
      enumdesc->name());
  printer->Annotate("name", enumdesc);

  std::set<std::string> used_name;
  std::vector<int> valid_index;
  for (int i = 0; i < enumdesc->value_count(); i++) {
    if (enumdesc->options().allow_alias() &&
        !used_name.insert(ToEnumCase(enumdesc->value(i)->name())).second) {
      continue;
    }
    valid_index.push_back(i);
  }
  for (auto i : valid_index) {
    const EnumValueDescriptor* value = enumdesc->value(i);
    printer->Print("  $name$: $value$$comma$\n", "name",
                   ToEnumCase(value->name()), "value", StrCat(value->number()),
                   "comma", (i == valid_index.back()) ? "" : ",");
    printer->Annotate("name", value);
  }

  printer->Print(
      "};\n"
      "\n");
}